

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlineProofChecker.h
# Opt level: O1

void __thiscall Minisat::OnlineProofChecker::printState(OnlineProofChecker *this)

{
  ulong *puVar1;
  uint uVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  
  if (1 < this->verbose) {
    fullCheck(this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"c [DRAT-OTFC] STATE:",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    if (0 < (this->unitClauses).sz) {
      lVar6 = 0;
      do {
        uVar2 = (this->unitClauses).data[lVar6].x;
        uVar5 = (int)uVar2 >> 1;
        uVar4 = ~uVar5;
        if ((uVar2 & 1) == 0) {
          uVar4 = uVar5 + 1;
        }
        std::ostream::operator<<((ostream *)&std::cerr,uVar4);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," 0",2);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
        std::ostream::put('X');
        std::ostream::flush();
        lVar6 = lVar6 + 1;
      } while (lVar6 < (this->unitClauses).sz);
    }
    if (0 < (this->clauses).sz) {
      lVar6 = 0;
      do {
        puVar3 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
        uVar2 = (this->clauses).data[lVar6];
        if ((puVar3[uVar2] & 3) == 0) {
          puVar1 = (ulong *)(puVar3 + uVar2);
          if (*puVar1 >> 0x22 != 0) {
            uVar7 = 0;
            do {
              uVar2 = *(uint *)((long)puVar1 + uVar7 * 4 + 8);
              uVar5 = (int)uVar2 >> 1;
              uVar4 = ~uVar5;
              if ((uVar2 & 1) == 0) {
                uVar4 = uVar5 + 1;
              }
              std::ostream::operator<<((ostream *)&std::cerr,uVar4);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
              uVar7 = uVar7 + 1;
            } while (uVar7 < *puVar1 >> 0x22);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"0",1);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
          std::ostream::put('X');
          std::ostream::flush();
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < (this->clauses).sz);
    }
  }
  return;
}

Assistant:

inline void OnlineProofChecker::printState()
{
    if (verbose < 2) {
        return;
    }

    fullCheck();

    std::cerr << "c [DRAT-OTFC] STATE:" << std::endl;
    for (int i = 0; i < unitClauses.size(); ++i) {
        std::cerr << unitClauses[i] << " 0" << std::endl;
    }
    for (int i = 0; i < clauses.size(); ++i) {
        const Clause &clause = ca[clauses[i]];
        if (clause.mark() != 0) {
            continue;
        } // jump over this clause
        for (int j = 0; j < clause.size(); ++j) {
            std::cerr << clause[j] << " ";
        }
        std::cerr << "0" << std::endl;
    }
}